

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O1

void __thiscall
jpge::jpeg_encoder::optimize_huffman_table(jpeg_encoder *this,int table_num,int table_len)

{
  uint8 (*pauVar1) [17];
  int *piVar2;
  uint8 uVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  byte bVar7;
  uint *puVar8;
  uint8 *puVar9;
  ulong uVar10;
  ulong uVar11;
  uint *puVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  uint *puVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  int *piVar22;
  int num_codes [33];
  sym_freq syms0 [257];
  sym_freq syms1 [257];
  undefined8 uStack_2450;
  int local_2448;
  int local_2444 [16];
  int aiStack_2404 [239];
  int aiStack_2048 [256];
  int aiStack_1c48 [256];
  uint local_1848 [256];
  uint auStack_1448 [256];
  uint local_1048 [516];
  uint local_838 [514];
  
  piVar22 = &local_2448;
  local_1048[0] = 1;
  local_1048[1] = 0;
  if (table_len < 1) {
    uVar21 = 1;
  }
  else {
    uVar21 = 1;
    uVar10 = 0;
    do {
      uVar18 = this->m_huff_count[table_num][uVar10];
      if (uVar18 != 0) {
        lVar15 = (long)(int)uVar21;
        local_1048[lVar15 * 2] = uVar18;
        uVar21 = uVar21 + 1;
        local_1048[lVar15 * 2 + 1] = (int)uVar10 + 1;
      }
      uVar10 = uVar10 + 1;
    } while ((uint)table_len != uVar10);
  }
  uStack_2450 = 0x11400a;
  memset(&local_2448,0,0x1000);
  uVar10 = (ulong)uVar21;
  if (uVar21 != 0) {
    uVar6 = 0;
    do {
      uVar18 = local_1048[uVar6 * 2];
      local_2444[(ulong)(uVar18 & 0xff) - 1] = local_2444[(ulong)(uVar18 & 0xff) - 1] + 1;
      piVar2 = (int *)((long)aiStack_2048 + (ulong)(uVar18 >> 6 & 0x3fc));
      *piVar2 = *piVar2 + 1;
      piVar2 = (int *)((long)aiStack_1c48 + (ulong)(uVar18 >> 0xe & 0x3fc));
      *piVar2 = *piVar2 + 1;
      piVar2 = (int *)((long)local_1848 + (ulong)(uVar18 >> 0x16 & 0xfffffffc));
      *piVar2 = *piVar2 + 1;
      uVar6 = uVar6 + 1;
    } while (uVar10 != uVar6);
  }
  uVar6 = 4;
  puVar8 = local_1848;
  do {
    if (*puVar8 != uVar21) goto LAB_0011407e;
    uVar6 = uVar6 - 1;
    puVar8 = puVar8 + -0x100;
  } while (1 < uVar6);
  uVar6 = 1;
LAB_0011407e:
  uVar11 = 0;
  bVar7 = 0;
  puVar8 = local_838;
  puVar16 = local_1048;
  do {
    puVar12 = puVar8;
    lVar15 = 0;
    uVar18 = 0;
    do {
      auStack_1448[lVar15] = uVar18;
      uVar18 = uVar18 + *(int *)((long)piVar22 + lVar15 * 4);
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0x100);
    if (uVar21 != 0) {
      uVar17 = 0;
      do {
        uVar19 = puVar16[uVar17 * 2] >> (bVar7 & 0x1f) & 0xff;
        uVar18 = auStack_1448[uVar19];
        auStack_1448[uVar19] = uVar18 + 1;
        *(undefined8 *)(puVar12 + (ulong)uVar18 * 2) = *(undefined8 *)(puVar16 + uVar17 * 2);
        uVar17 = uVar17 + 1;
      } while (uVar10 != uVar17);
    }
    uVar11 = uVar11 + 1;
    bVar7 = bVar7 + 8;
    piVar22 = (int *)((long)piVar22 + 0x400);
    puVar8 = puVar16;
    puVar16 = puVar12;
  } while (uVar11 != (uVar6 & 0xffffffff));
  if (uVar21 != 0) {
    if (uVar21 == 1) {
      *puVar12 = 1;
    }
    else {
      *puVar12 = *puVar12 + puVar12[2];
      uVar18 = uVar21 - 1;
      if (2 < (int)uVar21) {
        iVar13 = 0;
        iVar5 = 2;
        uVar6 = 1;
        do {
          lVar15 = (long)iVar13;
          if ((iVar5 < (int)uVar21) &&
             (lVar20 = (long)iVar5, puVar12[lVar20 * 2] <= puVar12[lVar15 * 2])) {
            iVar5 = iVar5 + 1;
            puVar12[uVar6 * 2] = puVar12[lVar20 * 2];
          }
          else {
            puVar12[uVar6 * 2] = puVar12[lVar15 * 2];
            iVar13 = iVar13 + 1;
            puVar12[lVar15 * 2] = (uint)uVar6;
          }
          lVar15 = (long)iVar13;
          if ((iVar5 < (int)uVar21) &&
             ((lVar20 = (long)iVar5, (long)uVar6 <= lVar15 ||
              (puVar12[lVar20 * 2] <= puVar12[lVar15 * 2])))) {
            iVar5 = iVar5 + 1;
            puVar12[uVar6 * 2] = puVar12[uVar6 * 2] + puVar12[lVar20 * 2];
          }
          else {
            puVar12[uVar6 * 2] = puVar12[uVar6 * 2] + puVar12[lVar15 * 2];
            iVar13 = iVar13 + 1;
            puVar12[lVar15 * 2] = (uint)uVar6;
          }
          uVar6 = uVar6 + 1;
        } while (uVar18 != uVar6);
      }
      puVar12[(long)(int)uVar21 * 2 + -4] = 0;
      if (2 < (int)uVar21) {
        lVar15 = (ulong)(uVar21 - 3) + 1;
        do {
          puVar12[lVar15 * 2 + -2] = puVar12[(ulong)puVar12[lVar15 * 2 + -2] * 2] + 1;
          lVar20 = lVar15 + -1;
          bVar4 = 0 < lVar15;
          lVar15 = lVar20;
        } while (lVar20 != 0 && bVar4);
      }
      uVar6 = (ulong)(uVar21 - 2);
      iVar5 = 1;
      uVar19 = 0;
      do {
        if ((int)uVar6 < 0) {
          iVar13 = 0;
        }
        else {
          iVar14 = (int)uVar6 + 1;
          iVar13 = 0;
          do {
            if (puVar12[uVar6 * 2] != uVar19) goto LAB_0011421b;
            iVar13 = iVar13 + 1;
            uVar6 = (ulong)((int)uVar6 - 1);
          } while (iVar14 != iVar13);
          uVar6 = 0xffffffff;
          iVar13 = iVar14;
        }
LAB_0011421b:
        if (iVar13 < iVar5) {
          puVar8 = puVar12 + (long)(int)uVar18 * 2;
          uVar18 = (uVar18 + iVar13) - iVar5;
          do {
            *puVar8 = uVar19;
            iVar5 = iVar5 + -1;
            puVar8 = puVar8 + -2;
          } while (iVar13 < iVar5);
        }
        iVar5 = iVar13 * 2;
        uVar19 = uVar19 + 1;
      } while (iVar13 != 0);
    }
  }
  uStack_2450 = 0x114255;
  memset(&local_2448,0,0x84);
  if (0 < (int)uVar21) {
    uVar6 = 0;
    do {
      local_2444[(ulong)puVar12[uVar6 * 2] - 1] = local_2444[(ulong)puVar12[uVar6 * 2] - 1] + 1;
      uVar6 = uVar6 + 1;
    } while (uVar10 != uVar6);
  }
  if (1 < (int)uVar21) {
    lVar15 = 0;
    do {
      local_2444[0xf] = local_2444[0xf] + aiStack_2404[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0x10);
    uVar6 = 0x11;
    bVar7 = 0;
    iVar5 = 0;
    do {
      iVar5 = iVar5 + (*(int *)((long)&uStack_2450 + uVar6 * 4 + 4) << (bVar7 & 0x1f));
      uVar6 = uVar6 - 1;
      bVar7 = bVar7 + 1;
    } while (1 < uVar6);
    for (; iVar5 != 0x10000; iVar5 = iVar5 + -1) {
      local_2444[0xf] = local_2444[0xf] + -1;
      uVar6 = 0x10;
      do {
        uVar18 = (int)uVar6 - 1;
        uVar6 = (ulong)uVar18;
        if (local_2444[uVar6 - 1] != 0) {
          local_2444[uVar6 - 1] = local_2444[uVar6 - 1] + -1;
          local_2444[uVar6] = local_2444[uVar6] + 2;
          break;
        }
      } while (1 < uVar18);
    }
  }
  pauVar1 = this->m_huff_bits + table_num;
  *(uint8 *)((long)pauVar1 + 0) = '\0';
  *(uint8 *)((long)pauVar1 + 1) = '\0';
  *(uint8 *)((long)pauVar1 + 2) = '\0';
  *(uint8 *)((long)pauVar1 + 3) = '\0';
  *(uint8 *)((long)pauVar1 + 4) = '\0';
  *(uint8 *)((long)pauVar1 + 5) = '\0';
  *(uint8 *)((long)pauVar1 + 6) = '\0';
  *(uint8 *)((long)pauVar1 + 7) = '\0';
  pauVar1 = this->m_huff_bits + table_num;
  *(uint8 *)((long)pauVar1 + 8) = '\0';
  *(uint8 *)((long)pauVar1 + 9) = '\0';
  *(uint8 *)((long)pauVar1 + 10) = '\0';
  *(uint8 *)((long)pauVar1 + 0xb) = '\0';
  *(uint8 *)((long)pauVar1 + 0xc) = '\0';
  *(uint8 *)((long)pauVar1 + 0xd) = '\0';
  *(uint8 *)((long)pauVar1 + 0xe) = '\0';
  *(uint8 *)((long)pauVar1 + 0xf) = '\0';
  this->m_huff_bits[table_num][0x10] = '\0';
  lVar15 = 0;
  do {
    this->m_huff_bits[table_num][lVar15 + 1] = (uint8)local_2444[lVar15];
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0x10);
  uVar6 = 0x11;
  do {
    uVar18 = (int)uVar6 - 1;
    uVar6 = (ulong)uVar18;
    uVar3 = this->m_huff_bits[table_num][uVar6];
    if (uVar3 != '\0') {
      this->m_huff_bits[table_num][uVar6] = uVar3 + 0xff;
      break;
    }
  } while (1 < uVar18);
  if (1 < (int)uVar21) {
    lVar15 = uVar10 + 1;
    puVar9 = this->m_huff_val[table_num] + ~uVar10 + (long)(int)uVar21 + 1;
    do {
      *puVar9 = (char)puVar12[lVar15 * 2 + -3] + 0xff;
      lVar15 = lVar15 + -1;
      puVar9 = puVar9 + 1;
    } while (2 < lVar15);
  }
  return;
}

Assistant:

void jpeg_encoder::optimize_huffman_table(int table_num, int table_len)
{
  sym_freq syms0[MAX_HUFF_SYMBOLS], syms1[MAX_HUFF_SYMBOLS];
  syms0[0].m_key = 1; syms0[0].m_sym_index = 0;  // dummy symbol, assures that no valid code contains all 1's
  int num_used_syms = 1;
  const uint32 *pSym_count = &m_huff_count[table_num][0];
  for (int i = 0; i < table_len; i++)
    if (pSym_count[i]) { syms0[num_used_syms].m_key = pSym_count[i]; syms0[num_used_syms++].m_sym_index = i + 1; }
  sym_freq* pSyms = radix_sort_syms(num_used_syms, syms0, syms1);
  calculate_minimum_redundancy(pSyms, num_used_syms);

  // Count the # of symbols of each code size.
  int num_codes[1 + MAX_HUFF_CODESIZE]; clear_obj(num_codes);
  for (int i = 0; i < num_used_syms; i++)
    num_codes[pSyms[i].m_key]++;

  const uint JPGE_CODE_SIZE_LIMIT = 16; // the maximum possible size of a JPEG Huffman code (valid range is [9,16] - 9 vs. 8 because of the dummy symbol)
  huffman_enforce_max_code_size(num_codes, num_used_syms, JPGE_CODE_SIZE_LIMIT);

  // Compute m_huff_bits array, which contains the # of symbols per code size.
  clear_obj(m_huff_bits[table_num]);
  for (int i = 1; i <= (int)JPGE_CODE_SIZE_LIMIT; i++)
    m_huff_bits[table_num][i] = static_cast<uint8>(num_codes[i]);

  // Remove the dummy symbol added above, which must be in largest bucket.
  for (int i = JPGE_CODE_SIZE_LIMIT; i >= 1; i--)
  {
    if (m_huff_bits[table_num][i]) { m_huff_bits[table_num][i]--; break; }
  }

  // Compute the m_huff_val array, which contains the symbol indices sorted by code size (smallest to largest).
  for (int i = num_used_syms - 1; i >= 1; i--)
    m_huff_val[table_num][num_used_syms - 1 - i] = static_cast<uint8>(pSyms[i].m_sym_index - 1);
}